

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O0

int tzloadbody(char *name,state *sp,_Bool doextend,local_storage *lsp)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  local_storage *plVar4;
  _Bool _Var5;
  int iVar6;
  int_fast32_t iVar7;
  int_fast32_t iVar8;
  int_fast32_t iVar9;
  int_fast32_t iVar10;
  int_fast32_t iVar11;
  int_fast32_t iVar12;
  size_t sVar13;
  state *psVar14;
  FILE *__stream;
  int *piVar15;
  ttinfo *ptVar16;
  char *__s2;
  int_fast64_t iVar17;
  byte *pbVar18;
  bool bVar19;
  long local_130;
  long local_128;
  long local_120;
  int local_114;
  int tsabbrlen;
  int j;
  char *tsabbr;
  int charcnt_1;
  int gotabbr;
  state *ts;
  ttinfo *ttisp_2;
  ttinfo *ttisp_1;
  int_fast32_t corr;
  int_fast64_t tr;
  uchar desigidx;
  uchar isdst;
  ttinfo *ttisp;
  uchar typ;
  time_t attime;
  int_fast64_t at;
  char *p;
  int_fast32_t charcnt;
  int_fast32_t typecnt;
  int_fast32_t timecnt;
  int_fast32_t leapcnt;
  int_fast32_t prevcorr;
  int_fast64_t prevtr;
  int_fast32_t ttisutcnt;
  int_fast32_t ttisstdcnt;
  int err;
  size_t namelen;
  char *dot;
  size_t tzheadsize;
  input_buffer *up;
  size_t sStack_50;
  _Bool doaccess;
  size_t nread;
  int stored;
  FILE *fid;
  int i;
  local_storage *lsp_local;
  _Bool doextend_local;
  state *sp_local;
  char *name_local;
  
  sp->goahead = false;
  sp->goback = false;
  sp_local = (state *)name;
  if (name == (char *)0x0) {
    sp_local = (state *)anon_var_dwarf_7c6;
  }
  if ((char)sp_local->leapcnt == ':') {
    sp_local = (state *)((long)&sp_local->leapcnt + 1);
  }
  plVar4 = (local_storage *)sp_local;
  if ((char)sp_local->leapcnt != '/') {
    sVar13 = strlen((char *)sp_local);
    if (0x13231 < sVar13) {
      return 0x24;
    }
    *(undefined8 *)lsp = 0x6168732f7273752f;
    builtin_strncpy((char *)((long)&(lsp->u).u + 8),"re/zonei",8);
    *(undefined4 *)((long)&(lsp->u).u + 0x10) = 0x2f6f666e;
    *(undefined2 *)((long)&(lsp->u).u + 0x14) = 0x2f;
    strcpy(lsp->fullname + 0x16,(char *)sp_local);
    namelen = (size_t)sp_local;
    while ((psVar14 = (state *)strchr((char *)namelen,0x2e), plVar4 = lsp, psVar14 != (state *)0x0
           && ((((psVar14 != sp_local && (psVar14[-1].field_0x5b8f != '/')) ||
                (*(char *)((long)&psVar14->leapcnt + 1) != '.')) ||
               ((plVar4 = lsp, *(char *)((long)&psVar14->leapcnt + 2) != '/' &&
                (plVar4 = lsp, *(char *)((long)&psVar14->leapcnt + 2) != '\0'))))))) {
      namelen = (long)&psVar14->leapcnt + 1;
    }
  }
  sp_local = (state *)&plVar4->u;
  __stream = fopen((char *)sp_local,"rb");
  if (__stream == (FILE *)0x0) {
    piVar15 = _PDCLIB_errno_func();
    name_local._4_4_ = *piVar15;
  }
  else {
    sStack_50 = fread(lsp,1,0xd6b8,__stream);
    if (sStack_50 < 0x2c) {
      piVar15 = _PDCLIB_errno_func();
      ttisutcnt = *piVar15;
      iVar6 = ferror(__stream);
      if (iVar6 == 0) {
        ttisutcnt = 0x16;
      }
      fclose(__stream);
      name_local._4_4_ = ttisutcnt;
    }
    else {
      iVar6 = fclose(__stream);
      if (iVar6 == -1) {
        piVar15 = _PDCLIB_errno_func();
        name_local._4_4_ = *piVar15;
      }
      else {
        for (nread._4_4_ = 4; nread._4_4_ < 9; nread._4_4_ = nread._4_4_ << 1) {
          iVar7 = detzcode(lsp->fullname + 0x18);
          iVar8 = detzcode(lsp->fullname + 0x14);
          _leapcnt = 0;
          timecnt = 0;
          iVar9 = detzcode(lsp->fullname + 0x1c);
          iVar10 = detzcode(lsp->fullname + 0x20);
          iVar11 = detzcode(lsp->fullname + 0x24);
          iVar12 = detzcode(lsp->fullname + 0x28);
          at = (long)lsp + 0x2c;
          if ((((((iVar9 < 0) || (0x31 < iVar9)) ||
                ((iVar11 < 0 || (((0xff < iVar11 || (iVar10 < 0)) || (1999 < iVar10)))))) ||
               ((iVar12 < 0 || (0x31 < iVar12)))) || ((iVar7 != iVar11 && (iVar7 != 0)))) ||
             ((iVar8 != iVar11 && (iVar8 != 0)))) {
            return 0x16;
          }
          if (sStack_50 <
              (ulong)((long)(iVar10 * nread._4_4_) + 0x2c + (long)iVar10 + (long)(iVar11 * 6) +
                      (long)iVar12 + (long)(iVar9 * (nread._4_4_ + 4)) + (long)iVar7 + (long)iVar8))
          {
            return 0x16;
          }
          sp->leapcnt = iVar9;
          sp->timecnt = iVar10;
          sp->typecnt = iVar11;
          sp->charcnt = iVar12;
          charcnt = 0;
          for (fid._4_4_ = 0; (int)fid._4_4_ < sp->timecnt; fid._4_4_ = fid._4_4_ + 1) {
            if (nread._4_4_ == 4) {
              iVar9 = detzcode((char *)at);
              local_120 = (long)iVar9;
            }
            else {
              local_120 = detzcode64((char *)at);
            }
            sp->types[(int)fid._4_4_] = local_120 <= 0x7fffffffffffffff;
            if (sp->types[(int)fid._4_4_] != '\0') {
              if (local_120 < -0x8000000000000000) {
                local_128 = -0x8000000000000000;
              }
              else {
                local_128 = local_120;
              }
              if ((charcnt != 0) && (local_128 <= sp->ats[charcnt + -1])) {
                if (local_128 < sp->ats[charcnt + -1]) {
                  return 0x16;
                }
                sp->types[(int)(fid._4_4_ + -1)] = '\0';
                charcnt = charcnt + -1;
              }
              sp->ats[charcnt] = local_128;
              charcnt = charcnt + 1;
            }
            at = at + nread._4_4_;
          }
          charcnt = 0;
          for (fid._4_4_ = 0; (int)fid._4_4_ < sp->timecnt; fid._4_4_ = fid._4_4_ + 1) {
            if (sp->typecnt <= (int)(uint)*(byte *)at) {
              return 0x16;
            }
            if (sp->types[(int)fid._4_4_] != '\0') {
              sp->types[charcnt] = *(byte *)at;
              charcnt = charcnt + 1;
            }
            at = at + 1;
          }
          sp->timecnt = charcnt;
          for (fid._4_4_ = 0; (int)fid._4_4_ < sp->typecnt; fid._4_4_ = fid._4_4_ + 1) {
            ptVar16 = sp->ttis + (int)fid._4_4_;
            iVar9 = detzcode((char *)at);
            ptVar16->utoff = iVar9;
            pbVar18 = (byte *)(at + 5);
            if (1 < *(byte *)(at + 4)) {
              return 0x16;
            }
            ptVar16->isdst = *(byte *)(at + 4) != 0;
            at = at + 6;
            if (sp->charcnt <= (int)(uint)*pbVar18) {
              return 0x16;
            }
            ptVar16->desigidx = (uint)*pbVar18;
          }
          for (fid._4_4_ = 0; (int)fid._4_4_ < sp->charcnt; fid._4_4_ = fid._4_4_ + 1) {
            sp->chars[(int)fid._4_4_] = *(char *)at;
            at = at + 1;
          }
          sp->chars[(int)fid._4_4_] = '\0';
          typecnt = 0;
          for (fid._4_4_ = 0; (int)fid._4_4_ < sp->leapcnt; fid._4_4_ = fid._4_4_ + 1) {
            if (nread._4_4_ == 4) {
              iVar9 = detzcode((char *)at);
              local_130 = (long)iVar9;
            }
            else {
              local_130 = detzcode64((char *)at);
            }
            iVar9 = detzcode((char *)(at + nread._4_4_));
            at = at + (nread._4_4_ + 4);
            if (local_130 < 0) {
              return 0x16;
            }
            if ((local_130 - _leapcnt < 0x24e9ff) ||
               ((iVar9 != timecnt + -1 && (iVar9 != timecnt + 1)))) {
              return 0x16;
            }
            _leapcnt = local_130;
            sp->lsis[typecnt].trans = local_130;
            sp->lsis[typecnt].corr = (long)iVar9;
            typecnt = typecnt + 1;
            timecnt = iVar9;
          }
          sp->leapcnt = typecnt;
          for (fid._4_4_ = 0; (int)fid._4_4_ < sp->typecnt; fid._4_4_ = fid._4_4_ + 1) {
            if (iVar7 == 0) {
              sp->ttis[(int)fid._4_4_].ttisstd = false;
            }
            else {
              if ((*(char *)at != '\x01') && (*(char *)at != '\0')) {
                return 0x16;
              }
              sp->ttis[(int)fid._4_4_].ttisstd = *(char *)at != '\0';
              at = at + 1;
            }
          }
          for (fid._4_4_ = 0; (int)fid._4_4_ < sp->typecnt; fid._4_4_ = fid._4_4_ + 1) {
            if (iVar8 == 0) {
              sp->ttis[(int)fid._4_4_].ttisut = false;
            }
            else {
              if ((*(char *)at != '\x01') && (*(char *)at != '\0')) {
                return 0x16;
              }
              sp->ttis[(int)fid._4_4_].ttisut = *(char *)at != '\0';
              at = at + 1;
            }
          }
          if (lsp->fullname[4] == '\0') break;
          sStack_50 = sStack_50 - (at - (long)lsp);
          memmove(lsp,(void *)at,sStack_50);
        }
        if ((((doextend) && (2 < sStack_50)) && (lsp->fullname[0] == '\n')) &&
           ((lsp->fullname[sStack_50 - 1] == '\n' && (sp->typecnt + 2 < 0x101)))) {
          psVar14 = &(lsp->u).st;
          lsp->fullname[sStack_50 - 1] = '\0';
          _Var5 = _PDCLIB_tzparse(lsp->fullname + 1,psVar14,false);
          if (_Var5) {
            tsabbr._4_4_ = 0;
            tsabbr._0_4_ = sp->charcnt;
            for (fid._4_4_ = 0; (int)fid._4_4_ < (lsp->u).st.typecnt; fid._4_4_ = fid._4_4_ + 1) {
              __s2 = lsp->fullname + (long)psVar14->ttis[(int)fid._4_4_].desigidx + 0x12d20;
              for (local_114 = 0; local_114 < (int)tsabbr; local_114 = local_114 + 1) {
                iVar6 = strcmp(sp->chars + local_114,__s2);
                if (iVar6 == 0) {
                  psVar14->ttis[(int)fid._4_4_].desigidx = local_114;
                  tsabbr._4_4_ = tsabbr._4_4_ + 1;
                  break;
                }
              }
              if ((int)tsabbr <= local_114) {
                sVar13 = strlen(__s2);
                if (local_114 + (int)sVar13 < 0x32) {
                  strcpy(sp->chars + local_114,__s2);
                  tsabbr._0_4_ = local_114 + (int)sVar13 + 1;
                  psVar14->ttis[(int)fid._4_4_].desigidx = local_114;
                  tsabbr._4_4_ = tsabbr._4_4_ + 1;
                }
              }
            }
            if (tsabbr._4_4_ == (lsp->u).st.typecnt) {
              sp->charcnt = (int)tsabbr;
              while( true ) {
                bVar19 = false;
                if (1 < sp->timecnt) {
                  bVar19 = sp->types[sp->timecnt + -1] == sp->types[sp->timecnt + -2];
                }
                if (!bVar19) break;
                sp->timecnt = sp->timecnt + -1;
              }
              fid._4_4_ = 0;
              while ((((int)fid._4_4_ < (lsp->u).st.timecnt && (sp->timecnt != 0)) &&
                     (lVar1 = sp->ats[sp->timecnt + -1],
                     lVar2 = *(long *)((long)lsp + (long)(int)fid._4_4_ * 8 + 0xd6d0),
                     iVar17 = leapcorr(sp,*(time_t *)((long)lsp + (long)(int)fid._4_4_ * 8 + 0xd6d0)
                                      ), lVar2 + iVar17 <= lVar1))) {
                fid._4_4_ = fid._4_4_ + 1;
              }
              while( true ) {
                bVar19 = false;
                if ((int)fid._4_4_ < (lsp->u).st.timecnt) {
                  bVar19 = sp->timecnt < 2000;
                }
                if (!bVar19) break;
                lVar1 = *(long *)((long)lsp + (long)(int)fid._4_4_ * 8 + 0xd6d0);
                iVar17 = leapcorr(sp,*(time_t *)((long)lsp + (long)(int)fid._4_4_ * 8 + 0xd6d0));
                sp->ats[sp->timecnt] = lVar1 + iVar17;
                sp->types[sp->timecnt] =
                     (char)sp->typecnt + lsp->fullname[(long)(int)fid._4_4_ + 0x11550];
                sp->timecnt = sp->timecnt + 1;
                fid._4_4_ = fid._4_4_ + 1;
              }
              for (fid._4_4_ = 0; (int)fid._4_4_ < (lsp->u).st.typecnt; fid._4_4_ = fid._4_4_ + 1) {
                iVar6 = sp->typecnt;
                sp->typecnt = iVar6 + 1;
                ptVar16 = sp->ttis + iVar6;
                uVar3 = *(undefined8 *)(lsp->fullname + (long)(int)fid._4_4_ * 0x10 + 0x11d20);
                ptVar16->utoff = (int)uVar3;
                ptVar16->isdst = (_Bool)(char)((ulong)uVar3 >> 0x20);
                *(int3 *)&ptVar16->field_0x5 = (int3)((ulong)uVar3 >> 0x28);
                uVar3 = *(undefined8 *)(lsp->fullname + (long)(int)fid._4_4_ * 0x10 + 0x11d20 + 8);
                ptVar16->desigidx = (int)uVar3;
                ptVar16->ttisstd = (_Bool)(char)((ulong)uVar3 >> 0x20);
                ptVar16->ttisut = (_Bool)(char)((ulong)uVar3 >> 0x28);
                *(short *)&ptVar16->field_0xe = (short)((ulong)uVar3 >> 0x30);
              }
            }
          }
        }
        if (sp->typecnt == 0) {
          name_local._4_4_ = 0x16;
        }
        else {
          if (1 < sp->timecnt) {
            for (fid._4_4_ = 1; (int)fid._4_4_ < sp->timecnt; fid._4_4_ = fid._4_4_ + 1) {
              _Var5 = typesequiv(sp,(uint)sp->types[(int)fid._4_4_],(uint)sp->types[0]);
              if ((_Var5) && (_Var5 = differ_by_repeat(sp->ats[(int)fid._4_4_],sp->ats[0]), _Var5))
              {
                sp->goback = true;
                break;
              }
            }
            for (fid._4_4_ = sp->timecnt + -2; -1 < (int)fid._4_4_; fid._4_4_ = fid._4_4_ + -1) {
              _Var5 = typesequiv(sp,(uint)sp->types[sp->timecnt + -1],
                                 (uint)sp->types[(int)fid._4_4_]);
              if ((_Var5) &&
                 (_Var5 = differ_by_repeat(sp->ats[sp->timecnt + -1],sp->ats[(int)fid._4_4_]), _Var5
                 )) {
                sp->goahead = true;
                break;
              }
            }
          }
          for (fid._4_4_ = 0; ((int)fid._4_4_ < sp->timecnt && (sp->types[(int)fid._4_4_] != '\0'));
              fid._4_4_ = fid._4_4_ + 1) {
          }
          bVar19 = (int)fid._4_4_ < sp->timecnt;
          fid._4_4_ = 0;
          if (bVar19) {
            fid._4_4_ = 0xffffffff;
          }
          if ((((int)fid._4_4_ < 0) && (0 < sp->timecnt)) &&
             ((sp->ttis[sp->types[0]].isdst & 1U) != 0)) {
            fid._4_4_ = (uint)sp->types[0];
            do {
              fid._4_4_ = fid._4_4_ - 1;
              if ((int)fid._4_4_ < 0) break;
            } while ((sp->ttis[(int)fid._4_4_].isdst & 1U) != 0);
          }
          if ((int)fid._4_4_ < 0) {
            fid._4_4_ = 0;
            do {
              if ((sp->ttis[(int)fid._4_4_].isdst & 1U) == 0) goto LAB_00105799;
              fid._4_4_ = fid._4_4_ + 1;
            } while ((int)fid._4_4_ < sp->typecnt);
            fid._4_4_ = 0;
          }
LAB_00105799:
          sp->defaulttype = fid._4_4_;
          name_local._4_4_ = 0;
        }
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

static int tzloadbody( char const * name, struct state * sp, bool doextend, union local_storage * lsp )
{
    int    i;
    FILE * fid;
    int    stored;
    size_t nread;
    bool   doaccess;
    union  input_buffer * up = &lsp->u.u;
    size_t tzheadsize = sizeof ( struct tzhead );

    sp->goback = sp->goahead = false;

    if ( ! name )
    {
        name = _PDCLIB_TZDEFAULT;

        if ( ! name )
        {
            return _PDCLIB_EINVAL;
        }
    }

    if ( name[ 0 ] == ':' )
    {
        ++name;
    }

    doaccess = name[ 0 ] == '/';

    if ( ! doaccess )
    {
        char const * dot;
        size_t namelen = strlen( name );

        if ( sizeof lsp->fullname - sizeof tzdirslash <= namelen )
        {
            return _PDCLIB_ENAMETOOLONG;
        }

        /* Create a string "TZDIR/NAME".  Using sprintf here
           would pull in stdio (and would fail if the
           resulting string length exceeded INT_MAX!).
        */
        memcpy( lsp->fullname, tzdirslash, sizeof tzdirslash );
        strcpy( lsp->fullname + sizeof tzdirslash, name );

        /* Set doaccess if NAME contains a ".." file name
           component, as such a name could read a file outside
           the TZDIR virtual subtree.
        */
        for ( dot = name; ( dot = strchr( dot, '.' ) ); ++dot )
        {
            if ( ( dot == name || dot[ -1 ] == '/' ) && dot[ 1 ] == '.' && ( dot[ 2 ] == '/' || ! dot[ 2 ] ) )
            {
                doaccess = true;
                break;
            }
        }

        name = lsp->fullname;
    }

    fid = fopen( name, "rb" );

    if ( fid == NULL )
    {
        return errno;
    }

    nread = fread( up->buf, 1, sizeof up->buf, fid );

    if ( nread < tzheadsize )
    {
        int err = errno;

        if ( ! ferror( fid ) )
        {
            err = _PDCLIB_EINVAL;
        }

        fclose( fid );
        return err;
    }

    if ( fclose( fid ) == EOF )
    {
        return errno;
    }

    for ( stored = 4; stored <= 8; stored *= 2 )
    {
        int_fast32_t ttisstdcnt = detzcode( up->tzhead.tzh_ttisstdcnt );
        int_fast32_t ttisutcnt = detzcode( up->tzhead.tzh_ttisutcnt );
        int_fast64_t prevtr = 0;
        int_fast32_t prevcorr = 0;
        int_fast32_t leapcnt = detzcode( up->tzhead.tzh_leapcnt );
        int_fast32_t timecnt = detzcode( up->tzhead.tzh_timecnt );
        int_fast32_t typecnt = detzcode( up->tzhead.tzh_typecnt );
        int_fast32_t charcnt = detzcode( up->tzhead.tzh_charcnt );
        char const *p = up->buf + tzheadsize;
        /* Although tzfile(5) currently requires typecnt to be nonzero,
           support future formats that may allow zero typecnt
           in files that have a TZ string and no transitions.
        */
        if ( ! ( 0 <= leapcnt && leapcnt < TZ_MAX_LEAPS
               && 0 <= typecnt && typecnt < TZ_MAX_TYPES
               && 0 <= timecnt && timecnt < TZ_MAX_TIMES
               && 0 <= charcnt && charcnt < TZ_MAX_CHARS
               && ( ttisstdcnt == typecnt || ttisstdcnt == 0 )
               && ( ttisutcnt == typecnt || ttisutcnt == 0 ) ) )
        {
            return _PDCLIB_EINVAL;
        }

        if ( nread
            < ( tzheadsize       /* struct tzhead */
              + timecnt * stored   /* ats */
              + timecnt        /* types */
              + typecnt * 6        /* ttinfos */
              + charcnt        /* chars */
              + leapcnt * ( stored + 4 ) /* lsinfos */
              + ttisstdcnt     /* ttisstds */
              + ttisutcnt ) )        /* ttisuts */
        {
            return _PDCLIB_EINVAL;
        }

        sp->leapcnt = leapcnt;
        sp->timecnt = timecnt;
        sp->typecnt = typecnt;
        sp->charcnt = charcnt;

        /* Read transitions, discarding those out of time_t range.
           But pretend the last transition before _PDCLIB_TIME_MIN
           occurred at _PDCLIB_TIME_MIN.
        */
        timecnt = 0;

        for ( i = 0; i < sp->timecnt; ++i )
        {
            int_fast64_t at = stored == 4 ? detzcode( p ) : detzcode64( p );
            sp->types[ i ] = at <= _PDCLIB_TIME_MAX;

            if ( sp->types[ i ] )
            {
                time_t attime = ( ( _PDCLIB_TYPE_SIGNED( time_t ) ? at < _PDCLIB_TIME_MIN : at < 0 ) ? _PDCLIB_TIME_MIN : at );

                if ( timecnt && attime <= sp->ats[ timecnt - 1 ] )
                {
                    if ( attime < sp->ats[ timecnt - 1 ] )
                    {
                        return _PDCLIB_EINVAL;
                    }

                    sp->types[ i - 1 ] = 0;
                    timecnt--;
                }

                sp->ats[ timecnt++ ] = attime;
            }

            p += stored;
        }

        timecnt = 0;

        for ( i = 0; i < sp->timecnt; ++i )
        {
            unsigned char typ = *p++;

            if ( sp->typecnt <= typ )
            {
                return _PDCLIB_EINVAL;
            }

            if ( sp->types[ i ] )
            {
                sp->types[ timecnt++ ] = typ;
            }
        }

        sp->timecnt = timecnt;

        for ( i = 0; i < sp->typecnt; ++i )
        {
            struct ttinfo * ttisp;
            unsigned char isdst, desigidx;

            ttisp = &sp->ttis[ i ];
            ttisp->utoff = detzcode( p );
            p += 4;
            isdst = *p++;

            if ( ! ( isdst < 2 ) )
            {
                return _PDCLIB_EINVAL;
            }

            ttisp->isdst = isdst;
            desigidx = *p++;

            if ( ! ( desigidx < sp->charcnt ) )
            {
                return _PDCLIB_EINVAL;
            }

            ttisp->desigidx = desigidx;
        }

        for ( i = 0; i < sp->charcnt; ++i )
        {
            sp->chars[ i ] = *p++;
        }

        sp->chars[ i ] = '\0';    /* ensure '\0' at end */

        /* Read leap seconds, discarding those out of time_t range.  */
        leapcnt = 0;

        for ( i = 0; i < sp->leapcnt; ++i )
        {
            int_fast64_t tr = stored == 4 ? detzcode( p ) : detzcode64( p );
            int_fast32_t corr = detzcode( p + stored );
            p += stored + 4;

            /* Leap seconds cannot occur before the Epoch.  */
            if ( tr < 0 )
            {
                return _PDCLIB_EINVAL;
            }

            if ( tr <= _PDCLIB_TIME_MAX )
            {
                /* Leap seconds cannot occur more than once per UTC month,
                   and UTC months are at least 28 days long (minus 1
                   second for a negative leap second).  Each leap second's
                   correction must differ from the previous one's by 1
                   second.
                */
                if ( tr - prevtr < 28 * SECSPERDAY - 1 || ( corr != prevcorr - 1 && corr != prevcorr + 1 ) )
                {
                    return _PDCLIB_EINVAL;
                }

                sp->lsis[ leapcnt ].trans = prevtr = tr;
                sp->lsis[ leapcnt ].corr = prevcorr = corr;
                ++leapcnt;
            }
        }

        sp->leapcnt = leapcnt;

        for ( i = 0; i < sp->typecnt; ++i )
        {
            struct ttinfo * ttisp;

            ttisp = &sp->ttis[ i ];

            if ( ttisstdcnt == 0 )
            {
                ttisp->ttisstd = false;
            }
            else
            {
                if ( *p != true && *p != false )
                {
                    return _PDCLIB_EINVAL;
                }

                ttisp->ttisstd = *p++;
            }
        }

        for ( i = 0; i < sp->typecnt; ++i )
        {
            struct ttinfo * ttisp;

            ttisp = &sp->ttis[ i ];

            if ( ttisutcnt == 0 )
            {
                ttisp->ttisut = false;
            }
            else
            {
                if ( *p != true && *p != false )
                {
                    return _PDCLIB_EINVAL;
                }

                ttisp->ttisut = *p++;
            }
        }

        /* If this is an old file, we're done. */
        if ( up->tzhead.tzh_version[ 0 ] == '\0' )
        {
            break;
        }

        nread -= p - up->buf;
        memmove( up->buf, p, nread );
    }

    if ( doextend && nread > 2 && up->buf[ 0 ] == '\n' && up->buf[ nread - 1 ] == '\n' && sp->typecnt + 2 <= TZ_MAX_TYPES )
    {
        struct state    *ts = &lsp->u.st;

        up->buf[ nread - 1 ] = '\0';

        if ( _PDCLIB_tzparse( &up->buf[ 1 ], ts, false ) )
        {
            /* Attempt to reuse existing abbreviations.
               Without this, America/Anchorage would be right on
               the edge after 2037 when TZ_MAX_CHARS is 50, as
               sp->charcnt equals 40 (for LMT AST AWT APT AHST
               AHDT YST AKDT AKST) and ts->charcnt equals 10
               (for AKST AKDT).  Reusing means sp->charcnt can
               stay 40 in this example.  */
            int gotabbr = 0;
            int charcnt = sp->charcnt;

            for ( i = 0; i < ts->typecnt; ++i )
            {
                char * tsabbr = ts->chars + ts->ttis[ i ].desigidx;
                int j;

                for ( j = 0; j < charcnt; ++j )
                {
                    if ( strcmp( sp->chars + j, tsabbr ) == 0 )
                    {
                        ts->ttis[ i ].desigidx = j;
                        ++gotabbr;
                        break;
                    }
                }

                if ( ! ( j < charcnt ) )
                {
                    int tsabbrlen = strlen( tsabbr );

                    if ( j + tsabbrlen < TZ_MAX_CHARS )
                    {
                        strcpy( sp->chars + j, tsabbr );
                        charcnt = j + tsabbrlen + 1;
                        ts->ttis[ i ].desigidx = j;
                        ++gotabbr;
                    }
                }
            }

            if ( gotabbr == ts->typecnt )
            {
                sp->charcnt = charcnt;

                /* Ignore any trailing, no-op transitions generated
                   by zic as they don't help here and can run afoul
                   of bugs in zic 2016j or earlier.  */
                while ( 1 < sp->timecnt && ( sp->types[ sp->timecnt - 1 ] == sp->types[ sp->timecnt - 2 ] ) )
                {
                    sp->timecnt--;
                }

                for ( i = 0; i < ts->timecnt; ++i )
                {
                    if ( sp->timecnt == 0 || ( sp->ats[ sp->timecnt - 1 ] < ts->ats[ i ] + leapcorr( sp, ts->ats[ i ] ) ) )
                    {
                        break;
                    }
                }

                while ( i < ts->timecnt && sp->timecnt < TZ_MAX_TIMES )
                {
                    sp->ats[ sp->timecnt ] = ts->ats[ i ] + leapcorr( sp, ts->ats[ i ] );
                    sp->types[ sp->timecnt ] = ( sp->typecnt + ts->types[ i ] );
                    sp->timecnt++;
                    ++i;
                }

                for ( i = 0; i < ts->typecnt; ++i )
                {
                    sp->ttis[ sp->typecnt++ ] = ts->ttis[ i ];
                }
            }
        }
    }

    if ( sp->typecnt == 0 )
    {
        return _PDCLIB_EINVAL;
    }

    if ( sp->timecnt > 1 )
    {
        for ( i = 1; i < sp->timecnt; ++i )
        {
            if ( typesequiv( sp, sp->types[ i ], sp->types[ 0 ] ) && differ_by_repeat( sp->ats[ i ], sp->ats[ 0 ] ) )
            {
                sp->goback = true;
                break;
            }
        }

        for ( i = sp->timecnt - 2; i >= 0; --i )
        {
            if ( typesequiv( sp, sp->types[ sp->timecnt - 1 ], sp->types[ i ] ) && differ_by_repeat( sp->ats[ sp->timecnt - 1 ], sp->ats[ i ] ) )
            {
                sp->goahead = true;
                break;
            }
        }
    }

    /* Infer sp->defaulttype from the data.  Although this default
       type is always zero for data from recent tzdb releases,
       things are trickier for data from tzdb 2018e or earlier.

       The first set of heuristics work around bugs in 32-bit data
       generated by tzdb 2013c or earlier.  The workaround is for
       zones like Australia/Macquarie where timestamps before the
       first transition have a time type that is not the earliest
       standard-time type.  See:
       https://mm.icann.org/pipermail/tz/2013-May/019368.html
    */
    /* If type 0 is unused in transitions, it's the type to use for early times. */
    for ( i = 0; i < sp->timecnt; ++i )
    {
        if ( sp->types[ i ] == 0 )
        {
            break;
        }
    }

    i = i < sp->timecnt ? -1 : 0;

    /* Absent the above,
       if there are transition times
       and the first transition is to a daylight time
       find the standard type less than and closest to
       the type of the first transition.
    */
    if ( i < 0 && sp->timecnt > 0 && sp->ttis[ sp->types[ 0 ] ].isdst )
    {
        i = sp->types[ 0 ];

        while ( --i >= 0 )
        {
            if ( ! sp->ttis[ i ].isdst )
            {
                break;
            }
        }
    }

    /* The next heuristics are for data generated by tzdb 2018e or
       earlier, for zones like EST5EDT where the first transition
       is to DST.
    */
    /* If no result yet, find the first standard type.
       If there is none, punt to type zero.
    */
    if ( i < 0 )
    {
        i = 0;

        while ( sp->ttis[ i ].isdst )
        {
            if ( ++i >= sp->typecnt )
            {
                i = 0;
                break;
            }
        }
    }

    /* A simple 'sp->defaulttype = 0;' would suffice here if we
       didn't have to worry about 2018e-or-earlier data.  Even
       simpler would be to remove the defaulttype member and just
       use 0 in its place.
    */
    sp->defaulttype = i;

    return 0;
}